

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderBase<Diligent::EngineVkImplTraits>::~ShaderBase
          (ShaderBase<Diligent::EngineVkImplTraits> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string msg;
  string local_30;
  
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00aedd78;
  if ((this->m_AsyncInitializer)._M_t.
      super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
      .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl !=
      (AsyncInitializer *)0x0) {
    AsyncInitializer::GetCompileTask((AsyncInitializer *)&local_30);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 0x10))();
      FormatString<char[117]>
                (&local_30,
                 (char (*) [117])
                 "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object."
                );
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"~ShaderBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
                 ,0x99);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar2 = (this->m_CombinedSamplerSuffix)._M_dataplus._M_p;
  paVar1 = &(this->m_CombinedSamplerSuffix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
  ~unique_ptr(&this->m_AsyncInitializer);
  DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                   );
  return;
}

Assistant:

~ShaderBase()
    {
        VERIFY(!GetCompileTask(), "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object.");
    }